

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O2

void __thiscall
Assimp::FBX::Node::
AddProperties<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,double,double,double>
          (Node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_1,double more_2,
          double more_3,double more_4)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,value);
  std::__cxx11::string::string((string *)&local_38,(string *)more);
  std::__cxx11::string::string((string *)&local_58,(string *)more_1);
  AddProperties<std::__cxx11::string,std::__cxx11::string,double,double,double>
            (this,&local_38,&local_58,more_2,more_3,more_4);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }